

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool ON_IsOrthonormalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  bVar1 = ON_IsOrthogonalFrame(X,Y);
  if (bVar1) {
    dVar2 = ABS(X->x);
    dVar3 = ABS(X->y);
    dVar4 = dVar3;
    if (dVar3 <= dVar2) {
      dVar4 = dVar2;
    }
    if (dVar4 <= 2.2250738585072014e-308) {
      if (dVar4 <= 0.0) {
        dVar4 = 0.0;
      }
    }
    else {
      if (dVar3 <= dVar2) {
        dVar2 = dVar3;
      }
      dVar2 = (dVar2 / dVar4) * (dVar2 / dVar4) + 1.0;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar4 = dVar4 * dVar2;
    }
    if (ABS(dVar4 + -1.0) <= 1.490116119385e-08) {
      dVar2 = ABS(Y->x);
      dVar3 = ABS(Y->y);
      dVar4 = dVar3;
      if (dVar3 <= dVar2) {
        dVar4 = dVar2;
      }
      if (dVar4 <= 2.2250738585072014e-308) {
        if (dVar4 <= 0.0) {
          dVar4 = 0.0;
        }
      }
      else {
        if (dVar3 <= dVar2) {
          dVar2 = dVar3;
        }
        dVar2 = (dVar2 / dVar4) * (dVar2 / dVar4) + 1.0;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        dVar4 = dVar4 * dVar2;
      }
      return ABS(dVar4 + -1.0) <= 1.490116119385e-08;
    }
  }
  return false;
}

Assistant:

bool ON_IsOrthonormalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthonormal frame
  if ( !ON_IsOrthogonalFrame( X, Y ) )
    return false;
  double x = X.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;
  x = Y.Length();
  if ( fabs(x-1.0) >  ON_SQRT_EPSILON )
    return false;

  return true;
}